

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O1

string * __thiscall Archive::Child::getName_abi_cxx11_(string *__return_storage_ptr__,Child *this)

{
  size_type *psVar1;
  uint uVar2;
  uint8_t *puVar3;
  undefined1 __nptr [8];
  int *piVar4;
  long lVar5;
  uint uVar6;
  undefined1 local_1e8 [8];
  string addr;
  char *local_60;
  undefined1 local_58 [8];
  string name;
  
  ArchiveMemberHeader::getName_abi_cxx11_((string *)local_58,(ArchiveMemberHeader *)this->data);
  if (*(char *)local_58 != '/') {
    if (((char *)((long)local_58 + -1))[(long)name._M_dataplus._M_p] == '/') {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_58);
      goto LAB_00c37335;
    }
LAB_00c371db:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_58 == (undefined1  [8])&name._M_string_length) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length);
      *(size_type *)((long)&__return_storage_ptr__->field_2 + 8) =
           name.field_2._M_allocated_capacity;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length);
    }
    __return_storage_ptr__->_M_string_length = (size_type)name._M_dataplus._M_p;
    name._M_dataplus._M_p = (pointer)0x0;
    name._M_string_length._0_1_ = 0;
    local_58 = (undefined1  [8])&name._M_string_length;
LAB_00c37335:
    if (local_58 != (undefined1  [8])&name._M_string_length) {
      operator_delete((void *)local_58,
                      CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length) + 1);
    }
    return __return_storage_ptr__;
  }
  if (name._M_dataplus._M_p == (pointer)0x2) {
    if (*(char *)((long)local_58 + 1) == '/') goto LAB_00c371db;
  }
  else if (name._M_dataplus._M_p == (pointer)0x1) goto LAB_00c371db;
  std::__cxx11::string::substr((ulong)local_1e8,(ulong)local_58);
  __nptr = local_1e8;
  piVar4 = __errno_location();
  name.field_2._12_4_ = *piVar4;
  *piVar4 = 0;
  lVar5 = strtol((char *)__nptr,&local_60,10);
  if ((undefined1  [8])local_60 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else {
    uVar6 = (uint)lVar5;
    if (((int)uVar6 == lVar5) && (*piVar4 != 0x22)) {
      if (*piVar4 == 0) {
        *piVar4 = name.field_2._12_4_;
      }
      psVar1 = &addr._M_string_length;
      if (local_1e8 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_1e8,addr._M_string_length + 1);
      }
      if (-1 < (int)uVar6) {
        uVar2 = (this->parent->stringTable).len;
        if (uVar6 < uVar2) {
          puVar3 = (this->parent->stringTable).data;
          local_1e8 = (undefined1  [8])psVar1;
          std::__cxx11::string::_M_construct<unsigned_char_const*>
                    ((string *)local_1e8,puVar3 + (uVar6 & 0x7fffffff),puVar3 + uVar2);
          std::__cxx11::string::find((char)local_1e8,10);
          std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_1e8);
          if (local_1e8 != (undefined1  [8])psVar1) {
            operator_delete((void *)local_1e8,addr._M_string_length + 1);
          }
          goto LAB_00c37335;
        }
      }
      ::wasm::Fatal::Fatal((Fatal *)local_1e8);
      ::wasm::Fatal::operator<<
                ((Fatal *)local_1e8,(char (*) [40])"Malformed archive: name parsing failed\n");
      ::wasm::Fatal::~Fatal((Fatal *)local_1e8);
    }
  }
  std::__throw_out_of_range("stoi");
}

Assistant:

std::string Archive::Child::getName() const {
  std::string name = getRawName();
  // Check if it's a special name.
  if (name[0] == '/') {
    if (name.size() == 1) { // Linker member.
      return name;
    }
    if (name.size() == 2 && name[1] == '/') { // String table.
      return name;
    }
    // It's a long name.
    // Get the offset.
    int offset = std::stoi(name.substr(1), nullptr, 10);

    // Verify it.
    if (offset < 0 || (unsigned)offset >= parent->stringTable.len) {
      wasm::Fatal() << "Malformed archive: name parsing failed\n";
    }

    std::string addr(parent->stringTable.data + offset,
                     parent->stringTable.data + parent->stringTable.len);

    // GNU long file names end with a "/\n".
    size_t end = addr.find('\n');
    return addr.substr(0, end - 1);
  }
  // It's a simple name.
  if (name[name.size() - 1] == '/') {
    return name.substr(0, name.size() - 1);
  }
  return name;
}